

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int quicly_open_stream(quicly_conn_t *conn,quicly_stream_t **_stream,int uni)

{
  st_quicly_linklist_t *psVar1;
  _func_void_void_ptr_char_ptr_varargs *p_Var2;
  st_quicly_stream_open_t *psVar3;
  int iVar4;
  long lVar5;
  quicly_stream_t *pqVar6;
  long lVar7;
  anon_struct_32_2_6d702f80_for_pending_link *paVar8;
  uint32_t initial_max_stream_data_local;
  anon_struct_80_2_8a8f9515_for_max_streams *paVar9;
  st_quicly_conn_streamgroup_state_t *psVar10;
  
  if (uni == 0) {
    psVar10 = &(conn->super).local.bidi;
    paVar9 = (anon_struct_80_2_8a8f9515_for_max_streams *)&(conn->egress).max_streams.bidi;
    initial_max_stream_data_local =
         (uint32_t)(((conn->super).ctx)->transport_params).max_stream_data.bidi_local;
    lVar5 = 0x298;
  }
  else {
    psVar10 = &(conn->super).local.uni;
    paVar9 = &(conn->egress).max_streams;
    initial_max_stream_data_local = 0;
    lVar5 = 0x2a0;
  }
  pqVar6 = open_stream(conn,psVar10->next_stream_id,initial_max_stream_data_local,
                       *(uint64_t *)((conn->super).local.cid_set.cids[0].cid.cid + lVar5 + -0x30));
  if (pqVar6 == (quicly_stream_t *)0x0) {
    iVar4 = 0x201;
  }
  else {
    psVar10->num_streams = psVar10->num_streams + 1;
    psVar10->next_stream_id = psVar10->next_stream_id + 4;
    lVar5 = pqVar6->stream_id;
    lVar7 = lVar5 + 3;
    if (-1 < lVar5) {
      lVar7 = lVar5;
    }
    if ((paVar9->uni).count <= (ulong)(lVar7 >> 2)) {
      pqVar6->field_0xb8 = pqVar6->field_0xb8 | 1;
      paVar8 = &(pqVar6->_send_aux).pending_link;
      if ((anon_struct_32_2_6d702f80_for_pending_link *)
          (pqVar6->_send_aux).pending_link.control.prev != paVar8) {
        __assert_fail("!quicly_linklist_is_linked(n)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/linklist.h"
                      ,0x38,"void quicly_linklist_insert(quicly_linklist_t *, quicly_linklist_t *)")
        ;
      }
      psVar1 = (st_quicly_linklist_t *)
               (conn->egress).retire_cid.sequences[(ulong)(uni == 0) * 2 + -7];
      (pqVar6->_send_aux).pending_link.control.prev = psVar1;
      (pqVar6->_send_aux).pending_link.control.next = psVar1->next;
      psVar1->next = &paVar8->control;
      ((pqVar6->_send_aux).pending_link.control.next)->prev = &paVar8->control;
    }
    p_Var2 = (conn->super).tracer.cb;
    if (p_Var2 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
      (*p_Var2)((conn->super).tracer.ctx,
                "{\"type\":\"stream-on-open\", \"time\":%lld, \"stream-id\":%d}\n",(conn->stash).now
               );
    }
    psVar3 = ((conn->super).ctx)->stream_open;
    iVar4 = (*psVar3->cb)(psVar3,pqVar6);
    if (iVar4 == 0) {
      *_stream = pqVar6;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int quicly_open_stream(quicly_conn_t *conn, quicly_stream_t **_stream, int uni)
{
    quicly_stream_t *stream;
    struct st_quicly_conn_streamgroup_state_t *group;
    uint64_t *max_stream_count;
    uint32_t max_stream_data_local;
    uint64_t max_stream_data_remote;
    int ret;

    /* determine the states */
    if (uni) {
        group = &conn->super.local.uni;
        max_stream_count = &conn->egress.max_streams.uni.count;
        max_stream_data_local = 0;
        max_stream_data_remote = conn->super.remote.transport_params.max_stream_data.uni;
    } else {
        group = &conn->super.local.bidi;
        max_stream_count = &conn->egress.max_streams.bidi.count;
        max_stream_data_local = (uint32_t)conn->super.ctx->transport_params.max_stream_data.bidi_local;
        max_stream_data_remote = conn->super.remote.transport_params.max_stream_data.bidi_remote;
    }

    /* open */
    if ((stream = open_stream(conn, group->next_stream_id, max_stream_data_local, max_stream_data_remote)) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    ++group->num_streams;
    group->next_stream_id += 4;

    /* adjust blocked */
    if (stream->stream_id / 4 >= *max_stream_count) {
        stream->streams_blocked = 1;
        quicly_linklist_insert((uni ? &conn->egress.pending_streams.blocked.uni : &conn->egress.pending_streams.blocked.bidi)->prev,
                               &stream->_send_aux.pending_link.control);
    }

    /* application-layer initialization */
    QUICLY_PROBE(STREAM_ON_OPEN, conn, conn->stash.now, stream);
    if ((ret = conn->super.ctx->stream_open->cb(conn->super.ctx->stream_open, stream)) != 0)
        return ret;

    *_stream = stream;
    return 0;
}